

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoInsertValue
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this,
          iterator position,value_type *value)

{
  size_type n;
  basic_string<char,_eastl::allocator> *result;
  basic_string<char,_eastl::allocator> *pbVar1;
  pointer pNewEnd;
  pointer pNewData;
  size_type nNewSize;
  size_type nPrevSize;
  basic_string<char,_eastl::allocator> *pValue;
  value_type *value_local;
  iterator position_local;
  vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this_local;
  
  if ((this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd
      == (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
         mpCapacity) {
    n = VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::GetNewCapacity
                  (&this->
                    super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>,
                   (size_type)
                   ((long)(this->
                          super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                          ).mpEnd -
                    (long)(this->
                          super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                          ).mpBegin >> 5));
    result = VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoAllocate
                       (&this->
                         super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                        ,n);
    pbVar1 = uninitialized_copy_ptr<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
                       ((this->
                        super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                        ).mpBegin,position,result);
    basic_string<char,_eastl::allocator>::basic_string(pbVar1,value);
    pbVar1 = uninitialized_copy_ptr<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
                       (position,(this->
                                 super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                                 ).mpEnd,pbVar1 + 1);
    DoDestroyValues(this,(this->
                         super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                         ).mpBegin,
                    (this->
                    super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
                    .mpEnd);
    VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoFree
              (&this->
                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>,
               (this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpBegin,(size_type)
                       ((long)(this->
                              super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                              ).mpCapacity -
                        (long)(this->
                              super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                              ).mpBegin >> 5));
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpBegin
         = result;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd =
         pbVar1;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
    mpCapacity = result + n;
  }
  else {
    _nNewSize = value;
    if ((position <= value) &&
       (value < (this->
                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                mpEnd)) {
      _nNewSize = value + 1;
    }
    basic_string<char,_eastl::allocator>::basic_string
              ((this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpEnd,(this->
                     super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                     ).mpEnd + -1);
    copy_backward<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
              (position,(this->
                        super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                        ).mpEnd + -1,
               (this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpEnd);
    basic_string<char,_eastl::allocator>::operator=(position,_nNewSize);
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd =
         (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
         mpEnd + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, value_type&& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(std::forward<T>(*(mpEnd - 1)));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(std::forward<T>(value));
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }